

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::ParquetReader::CreateReaderRecursive
          (ParquetReader *this,ClientContext *context,vector<duckdb::ColumnIndex,_true> *indexes,
          ParquetColumnSchema *schema)

{
  vector<duckdb::ParquetColumnSchema,_true> *this_00;
  byte bVar1;
  int iVar2;
  __buckets_ptr pp_Var3;
  __buckets_ptr pp_Var4;
  size_type __n;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var5;
  undefined8 uVar6;
  ParquetFileMetadataCache *pPVar7;
  ParquetReader *reader;
  pointer pcVar8;
  const_reference pvVar9;
  reference pvVar10;
  InternalException *pIVar11;
  pointer pcVar12;
  idx_t i;
  ulong uVar13;
  ClientContext *in_R8;
  allocator local_79;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> local_78;
  undefined1 local_70 [40];
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
  children;
  
  iVar2 = *(int *)&(in_R8->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
  local_78._M_head_impl = (ColumnReader *)this;
  if (iVar2 == 0) {
    pp_Var3 = *(__buckets_ptr *)((long)&(in_R8->config).profiler_save_location.field_2 + 8);
    pp_Var4 = (in_R8->config).profiler_settings._M_h._M_buckets;
    if (pp_Var3 == pp_Var4) {
      ColumnReader::CreateReader
                ((ColumnReader *)this,(ParquetReader *)context,(ParquetColumnSchema *)in_R8);
    }
    else {
      children.
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ::resize(&children.
                super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
               ,((long)pp_Var4 - (long)pp_Var3) / 0x90);
      this_00 = (vector<duckdb::ParquetColumnSchema,_true> *)
                ((long)&(in_R8->config).profiler_save_location.field_2 + 8);
      pcVar12 = *(pointer *)schema;
      pcVar8 = (schema->name)._M_dataplus._M_p;
      local_70._32_8_ = in_R8;
      if (pcVar12 == pcVar8) {
        for (uVar13 = 0;
            uVar13 < (ulong)(((long)(((profiler_settings_t *)(local_70._32_8_ + 0x80))->_M_h).
                                    _M_buckets - *(long *)(local_70._32_8_ + 0x78)) / 0x90);
            uVar13 = uVar13 + 1) {
          vector<duckdb::ParquetColumnSchema,_true>::get<true>(this_00,uVar13);
          CreateReaderRecursive((ParquetReader *)local_70,context,indexes,schema);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                    ::get<true>(&children,uVar13);
          uVar6 = local_70._0_8_;
          local_70._0_8_ = (ColumnReader *)0x0;
          _Var5._M_head_impl =
               (pvVar10->
               super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
               .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
          (pvVar10->
          super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
          super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
          .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)uVar6
          ;
          if (_Var5._M_head_impl != (ColumnReader *)0x0) {
            (**(code **)((long)(_Var5._M_head_impl)->_vptr_ColumnReader + 8))();
          }
          if ((ColumnReader *)local_70._0_8_ != (ColumnReader *)0x0) {
            (**(code **)(*(long *)local_70._0_8_ + 8))();
          }
        }
      }
      else {
        for (uVar13 = 0; uVar13 < (ulong)((long)pcVar8 - (long)pcVar12 >> 5); uVar13 = uVar13 + 1) {
          pvVar9 = vector<duckdb::ColumnIndex,_true>::get<true>
                             ((vector<duckdb::ColumnIndex,_true> *)schema,uVar13);
          __n = pvVar9->index;
          pvVar9 = vector<duckdb::ColumnIndex,_true>::get<true>
                             ((vector<duckdb::ColumnIndex,_true> *)schema,uVar13);
          vector<duckdb::ParquetColumnSchema,_true>::get<true>(this_00,__n);
          CreateReaderRecursive
                    ((ParquetReader *)local_70,context,indexes,
                     (ParquetColumnSchema *)&pvVar9->child_indexes);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                    ::get<true>(&children,__n);
          uVar6 = local_70._0_8_;
          local_70._0_8_ = (ColumnReader *)0x0;
          _Var5._M_head_impl =
               (pvVar10->
               super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
               .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
          (pvVar10->
          super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
          super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
          .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)uVar6
          ;
          if (_Var5._M_head_impl != (ColumnReader *)0x0) {
            (**(code **)((long)(_Var5._M_head_impl)->_vptr_ColumnReader + 8))();
          }
          if ((ColumnReader *)local_70._0_8_ != (ColumnReader *)0x0) {
            (**(code **)(*(long *)local_70._0_8_ + 8))();
          }
          pcVar12 = *(pointer *)schema;
          pcVar8 = (schema->name)._M_dataplus._M_p;
        }
      }
      bVar1 = *(byte *)&(((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                           *)(local_70._32_8_ + 0x28))->
                        super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl
      ;
      if (bVar1 - 0x65 < 2) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                  ::get<true>(&children,0);
        make_uniq<duckdb::ListColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&,duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>>
                  ((duckdb *)local_70,(ParquetReader *)context,
                   (ParquetColumnSchema *)local_70._32_8_,pvVar10);
      }
      else {
        if (bVar1 != 100) {
          pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_70,"Unsupported schema type for schema with children",&local_79
                    );
          InternalException::InternalException(pIVar11,(string *)local_70);
          __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        make_uniq<duckdb::StructColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&,duckdb::vector<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>,true>>
                  ((duckdb *)local_70,(ParquetReader *)context,
                   (ParquetColumnSchema *)local_70._32_8_,&children);
      }
      (local_78._M_head_impl)->_vptr_ColumnReader = (_func_int **)local_70._0_8_;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ::~vector(&children.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
               );
      this = (ParquetReader *)local_78;
    }
  }
  else if (iVar2 == 1) {
    make_uniq<duckdb::RowNumberColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)local_70,(ParquetReader *)context,(ParquetColumnSchema *)in_R8);
    (local_78._M_head_impl)->_vptr_ColumnReader = local_70._0_8_;
    this = (ParquetReader *)local_78;
  }
  else {
    if (iVar2 != 2) {
      pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_70,"Unsupported ParquetColumnSchemaType",(allocator *)&children);
      InternalException::InternalException(pIVar11,(string *)local_70);
      __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar7 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->
                       ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)
                        &(context->config).asof_loop_join_threshold);
    reader = (ParquetReader *)
             unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
             ::operator->(&pPVar7->geo_metadata);
    this = (ParquetReader *)local_78;
    GeoParquetFileMetadata::CreateColumnReader
              ((GeoParquetFileMetadata *)local_78._M_head_impl,reader,(ParquetColumnSchema *)context
               ,in_R8);
  }
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>)this;
}

Assistant:

unique_ptr<ColumnReader> ParquetReader::CreateReaderRecursive(ClientContext &context,
                                                              const vector<ColumnIndex> &indexes,
                                                              const ParquetColumnSchema &schema) {
	switch (schema.schema_type) {
	case ParquetColumnSchemaType::GEOMETRY:
		return metadata->geo_metadata->CreateColumnReader(*this, schema, context);
	case ParquetColumnSchemaType::FILE_ROW_NUMBER:
		return make_uniq<RowNumberColumnReader>(*this, schema);
	case ParquetColumnSchemaType::COLUMN: {
		if (schema.children.empty()) {
			// leaf reader
			return ColumnReader::CreateReader(*this, schema);
		}
		vector<unique_ptr<ColumnReader>> children;
		children.resize(schema.children.size());
		if (indexes.empty()) {
			for (idx_t child_index = 0; child_index < schema.children.size(); child_index++) {
				children[child_index] = CreateReaderRecursive(context, indexes, schema.children[child_index]);
			}
		} else {
			for (idx_t i = 0; i < indexes.size(); i++) {
				auto child_index = indexes[i].GetPrimaryIndex();
				children[child_index] =
				    CreateReaderRecursive(context, indexes[i].GetChildIndexes(), schema.children[child_index]);
			}
		}
		switch (schema.type.id()) {
		case LogicalTypeId::LIST:
		case LogicalTypeId::MAP:
			D_ASSERT(children.size() == 1);
			return make_uniq<ListColumnReader>(*this, schema, std::move(children[0]));
		case LogicalTypeId::STRUCT:
			return make_uniq<StructColumnReader>(*this, schema, std::move(children));
		default:
			throw InternalException("Unsupported schema type for schema with children");
		}
	}
	default:
		throw InternalException("Unsupported ParquetColumnSchemaType");
	}
}